

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O2

void __thiscall
OpenMD::NameFinder::matchInternalIndex
          (NameFinder *this,string *name,int internalIndex,SelectionSet *bs)

{
  NameFinder *__return_storage_ptr__;
  pointer ppAVar1;
  bool bVar2;
  Molecule *this_00;
  int iVar3;
  pointer ppRVar4;
  NameFinder *this_01;
  MoleculeIterator mi;
  MoleculeIterator local_58 [5];
  
  local_58[0]._M_node = (_Base_ptr)0x0;
  this_00 = SimInfo::beginMolecule(this->info_,local_58);
  __return_storage_ptr__ = (NameFinder *)(local_58 + 1);
  while (this_00 != (Molecule *)0x0) {
    this_01 = __return_storage_ptr__;
    Molecule::getType_abi_cxx11_((string *)__return_storage_ptr__,this_00);
    bVar2 = isMatched(this_01,(string *)__return_storage_ptr__,name);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    if (bVar2) {
      ppAVar1 = (this_00->atoms_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppRVar4 = (this_00->rigidBodies_).
                super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar3 = (int)((ulong)((long)(this_00->atoms_).
                                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar1) >> 3);
      if (internalIndex <
          (int)((ulong)((long)(this_00->rigidBodies_).
                              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar4) >> 3) +
          iVar3) {
        ppRVar4 = ppRVar4 + (uint)(internalIndex - iVar3);
        if (internalIndex < iVar3) {
          ppRVar4 = (pointer)(ppAVar1 + (uint)internalIndex);
        }
        OpenMDBitSet::setBitOn
                  ((bs->bitsets_).
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)((*ppRVar4)->super_StuntDouble).globalIndex_);
      }
    }
    this_00 = SimInfo::nextMolecule(this->info_,local_58);
  }
  return;
}

Assistant:

void NameFinder::matchInternalIndex(const std::string& name,
                                      int internalIndex, SelectionSet& bs) {
    SimInfo::MoleculeIterator mi;
    Molecule* mol;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      if (isMatched(mol->getType(), name)) {
        int natoms       = mol->getNAtoms();
        int nrigidbodies = mol->getNRigidBodies();
        if (internalIndex >= natoms + nrigidbodies) {
          continue;
        } else if (internalIndex < natoms) {
          bs.bitsets_[STUNTDOUBLE].setBitOn(
              mol->getAtomAt(internalIndex)->getGlobalIndex());
          continue;
        } else if (internalIndex < natoms + nrigidbodies) {
          bs.bitsets_[STUNTDOUBLE].setBitOn(
              mol->getRigidBodyAt(internalIndex - natoms)->getGlobalIndex());
        }
      }
    }
  }